

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-el.cpp
# Opt level: O0

void __thiscall IntVarEL::initBLits(IntVarEL *this)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  SAT *unaff_retaddr;
  Reason in_stack_00000008;
  Lit in_stack_00000014;
  int i_1;
  int i;
  int in_stack_00000084;
  SAT *in_stack_00000088;
  ChannelInfo in_stack_00000090;
  IntVarEL *in_stack_ffffffffffffffb8;
  Reason local_30;
  int local_28;
  int local_24;
  Reason local_20;
  int local_18;
  int local_14;
  ChannelInfo local_10 [2];
  
  if (*(int *)(in_RDI + 0x6c) == -0x80000000) {
    if (*(int *)(in_RDI + 0x60) == -0x80000000) {
      iVar1 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0xc));
      *(int *)(in_RDI + 0x60) = iVar1;
      iVar1 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x10));
      *(int *)(in_RDI + 100) = iVar1;
    }
    iVar1 = SAT::nVars((SAT *)0x170874);
    *(int *)(in_RDI + 0x6c) = (iVar1 - *(int *)(in_RDI + 0x60)) * 2 + 1;
    ChannelInfo::ChannelInfo(local_10,*(uint *)(in_RDI + 8),1,1,*(int *)(in_RDI + 0x60) + -1);
    SAT::newVar(in_stack_00000088,in_stack_00000084,in_stack_00000090);
    for (local_14 = *(int *)(in_RDI + 0x60); iVar1 = local_14,
        iVar2 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0xc)), iVar1 <= iVar2;
        local_14 = local_14 + 1) {
      local_18 = (int)getGELit(in_stack_ffffffffffffffb8,0);
      Reason::Reason(&local_20,(Clause *)0x0);
      SAT::cEnqueue(unaff_retaddr,in_stack_00000014,in_stack_00000008);
    }
    for (local_24 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x10));
        local_24 <= *(int *)(in_RDI + 100); local_24 = local_24 + 1) {
      local_28 = (int)getLELit(in_stack_ffffffffffffffb8,0);
      Reason::Reason(&local_30,(Clause *)0x0);
      SAT::cEnqueue(unaff_retaddr,in_stack_00000014,in_stack_00000008);
    }
  }
  return;
}

Assistant:

void IntVarEL::initBLits() {
	if (base_blit != INT_MIN) {
		return;
	}
	if (lit_min == INT_MIN) {
		lit_min = min;
		lit_max = max;
	}
	base_blit = 2 * (sat.nVars() - lit_min) + 1;
	sat.newVar(lit_max - lit_min + 2, ChannelInfo(var_id, 1, 1, lit_min - 1));
	for (int i = lit_min; i <= min; i++) {
		sat.cEnqueue(getGELit(i), nullptr);
	}
	for (int i = max; i <= lit_max; i++) {
		sat.cEnqueue(getLELit(i), nullptr);
	}
}